

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

CBString * __thiscall
Bstrlib::CBString::midstr(CBString *__return_storage_ptr__,CBString *this,int left,int len)

{
  undefined1 local_30 [8];
  tagbstring t;
  int len_local;
  int left_local;
  CBString *this_local;
  
  t.data._0_4_ = len;
  t.data._4_4_ = left;
  if (left < 0) {
    t.data._0_4_ = left + len;
    t.data._4_4_ = 0;
  }
  if ((this->super_tagbstring).slen - t.data._4_4_ < (int)t.data) {
    t.data._0_4_ = (this->super_tagbstring).slen - t.data._4_4_;
  }
  if ((int)t.data < 1) {
    CBString(__return_storage_ptr__,anon_var_dwarf_23d28 + 0x10);
  }
  else {
    t._0_8_ = (this->super_tagbstring).data + t.data._4_4_;
    local_30._4_4_ = (int)t.data;
    local_30._0_4_ = -1;
    CBString(__return_storage_ptr__,(tagbstring *)local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

CBString CBString::midstr (int left, int len) const {
struct tagbstring t;
	if (left < 0) {
		len += left;
		left = 0;
	}
	if (len > slen - left) len = slen - left;
	if (len <= 0) return CBString ("");
	blk2tbstr (t, data + left, len);
	return CBString (t);
}